

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O3

CURLcode Curl_write(Curl_easy *data,curl_socket_t sockfd,void *mem,size_t len,ssize_t *written)

{
  uint in_EAX;
  ssize_t sVar1;
  ulong uVar2;
  undefined8 uStack_18;
  
  if (sockfd == -1) {
    uVar2 = 0;
  }
  else {
    uVar2 = (ulong)(data->conn->sock[1] == sockfd);
  }
  uStack_18 = (ulong)in_EAX;
  sVar1 = (*data->conn->send[uVar2])(data,(int)uVar2,mem,len,(CURLcode *)((long)&uStack_18 + 4));
  if (uStack_18._4_4_ != CURLE_OK) {
    if (uStack_18._4_4_ == CURLE_AGAIN) {
      uStack_18._4_4_ = CURLE_OK;
      sVar1 = 0;
    }
    else {
      sVar1 = -1;
    }
  }
  *written = sVar1;
  return uStack_18._4_4_;
}

Assistant:

CURLcode Curl_write(struct Curl_easy *data,
                    curl_socket_t sockfd,
                    const void *mem,
                    size_t len,
                    ssize_t *written)
{
  struct connectdata *conn;
  int num;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);
  conn = data->conn;
  num = (sockfd != CURL_SOCKET_BAD && sockfd == conn->sock[SECONDARYSOCKET]);
  return Curl_nwrite(data, num, mem, len, written);
}